

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

int check_bbytes(char *buf,size_t buf_size,char *bb,size_t bb_size)

{
  int iVar1;
  
  if (buf_size == bb_size && bb != (char *)0x0) {
    iVar1 = bcmp(buf,bb,buf_size);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else if (bb == (char *)0x0) goto LAB_0011432a;
  hex_dump("expected",bb,bb_size);
  mp_dump(bb,bb_size);
LAB_0011432a:
  hex_dump("got",buf,buf_size);
  mp_dump(buf,buf_size);
  hex_dump_c(buf,buf_size);
  return -1;
}

Assistant:

int
check_bbytes(const char *buf, size_t buf_size, const char *bb, size_t bb_size) {
	if (bb == NULL) goto error;
	if (buf_size != bb_size) goto error;
	if (memcmp(buf, bb, bb_size)) goto error;
	return 0;
error:
	if (bb) {
		hex_dump("expected", bb, bb_size);
		mp_dump(bb, bb_size);
	}
	hex_dump("got", (const char *)buf, buf_size);
	mp_dump(buf, buf_size);
	hex_dump_c((const char *)buf, buf_size);
	return -1;
}